

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSM::output(FSM *this,string *var_name,shared_ptr<kratos::Var> *default_)

{
  undefined1 local_30 [8];
  shared_ptr<kratos::Var> var;
  
  Generator::get_var((Generator *)local_30,(string *)this->generator_);
  output(this,(shared_ptr<kratos::Var> *)local_30,default_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
  return;
}

Assistant:

void FSM::output(const std::string& var_name, const std::shared_ptr<Var>& default_) {
    auto var = generator_->get_var(var_name);
    output(var, default_);
}